

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  type_conflict5 tVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint local_18c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  cpp_dec_float<50U,_int,_void> local_128;
  long local_f0;
  cpp_dec_float<50U,_int,_void> *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar9) + 0xa48) + 0x50));
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar5 = **(long **)(CONCAT44(extraout_var_00,iVar9) + 0xa48);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar14 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar9) + 0xa48) + 0x70);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar12 = *(long *)(CONCAT44(extraout_var_02,iVar9) + 0xa48);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(CONCAT44(extraout_var_03,iVar9) + 0xa10);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_f0 = *(long *)(CONCAT44(extraout_var_04,iVar9) + 0xa28);
  iVar9 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var_05,iVar9));
  local_128.data._M_elems._32_5_ = 0;
  local_128.data._M_elems[9]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems._24_5_ = 0;
  local_128.data._M_elems[7]._1_3_ = 0;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.prec_elem = 10;
  y.m_backend.data._M_elems._0_8_ = (ulong)y.m_backend.data._M_elems[1] << 0x20;
  tVar8 = boost::multiprecision::operator>(val,(int *)&y);
  local_e8 = &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).delta.m_backend;
  local_18c = 0xffffffff;
  if (tVar8) {
    for (lVar11 = 0; lVar11 < *(int *)(lVar12 + 0x58); lVar11 = lVar11 + 1) {
      uVar3 = *(uint *)(*(long *)(lVar12 + 0x60) + lVar11 * 4);
      lVar13 = (long)(int)uVar3 * 0x38;
      uVar7 = *(undefined8 *)(lVar14 + 0x20 + lVar13);
      local_128.data._M_elems._32_5_ = SUB85(uVar7,0);
      local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar14 + lVar13);
      local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar14 + lVar13) + 2);
      puVar2 = (uint *)(lVar14 + 0x10 + lVar13);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar7 = *(undefined8 *)(puVar2 + 2);
      local_128.data._M_elems._24_5_ = SUB85(uVar7,0);
      local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_128.exp = *(int *)(lVar14 + 0x28 + lVar13);
      local_128.neg = *(bool *)(lVar14 + 0x2c + lVar13);
      local_128._48_8_ = *(undefined8 *)(lVar14 + 0x30 + lVar13);
      tVar8 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_128,&epsilon);
      if (tVar8) {
        pdVar10 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar10,(type *)0x0);
        tVar8 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar6 + lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar8) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar6 + lVar13),
                     (cpp_dec_float<50U,_int,_void> *)(lVar13 + lVar5));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,local_e8);
LAB_0023ae51:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems._24_5_ = 0;
          y.m_backend.data._M_elems[7]._1_3_ = 0;
          y.m_backend.data._M_elems._32_5_ = 0;
          y.m_backend.data._M_elems[9]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_128);
          tVar8 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,val);
          if (tVar8) {
            *(ulong *)((val->m_backend).data._M_elems + 8) =
                 CONCAT35(y.m_backend.data._M_elems[9]._1_3_,y.m_backend.data._M_elems._32_5_);
            *(undefined8 *)((val->m_backend).data._M_elems + 4) = y.m_backend.data._M_elems._16_8_;
            *(ulong *)((val->m_backend).data._M_elems + 6) =
                 CONCAT35(y.m_backend.data._M_elems[7]._1_3_,y.m_backend.data._M_elems._24_5_);
            *(undefined8 *)(val->m_backend).data._M_elems = y.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((val->m_backend).data._M_elems + 2) = y.m_backend.data._M_elems._8_8_;
            (val->m_backend).exp = y.m_backend.exp;
            (val->m_backend).neg = y.m_backend.neg;
            (val->m_backend).fpclass = y.m_backend.fpclass;
            (val->m_backend).prec_elem = y.m_backend.prec_elem;
            local_18c = uVar3;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar7 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
        y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
        y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar7;
        tVar8 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_128,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar8) {
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)(local_f0 + lVar13);
          pdVar10 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar10,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar1,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar8) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,pcVar1,(cpp_dec_float<50U,_int,_void> *)(lVar13 + lVar5));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&result.m_backend,local_e8);
            goto LAB_0023ae51;
          }
        }
      }
    }
    if ((int)local_18c < 0) {
      return local_18c;
    }
    lVar12 = (ulong)local_18c * 0x38;
    uVar7 = *(undefined8 *)(lVar14 + 0x20 + lVar12);
    local_128.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar14 + lVar12);
    local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar14 + lVar12) + 2);
    puVar2 = (uint *)(lVar14 + 0x10 + lVar12);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar7 = *(undefined8 *)(puVar2 + 2);
    local_128.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_128.exp = *(int *)(lVar14 + 0x28 + lVar12);
    local_128.neg = *(bool *)(lVar14 + 0x2c + lVar12);
    local_128._48_8_ = *(undefined8 *)(lVar14 + 0x30 + lVar12);
    tVar8 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128,&epsilon);
    if ((!tVar8) ||
       (tVar8 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar5 + lVar12),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar6 + lVar12)), !tVar8)) {
      y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
      uVar7 = y.m_backend.data._M_elems._0_8_;
      y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
      y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
      y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
      y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
      y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
      y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
      y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
      y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
      y.m_backend.exp = epsilon.m_backend.exp;
      y.m_backend.neg = epsilon.m_backend.neg;
      y.m_backend.fpclass = epsilon.m_backend.fpclass;
      y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
      y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0) {
        y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
      }
      y.m_backend.data._M_elems._0_8_ = uVar7;
      tVar8 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_128,&y);
      lVar14 = local_f0;
      if ((!tVar8) ||
         (tVar8 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(lVar5 + lVar12),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(local_f0 + lVar12)), !tVar8)) {
        tVar8 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_128,&epsilon);
        goto LAB_0023b435;
      }
    }
  }
  else {
    lVar11 = 0;
    while( true ) {
      y.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
      y.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
      y.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
      y.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
      y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      uVar3 = y.m_backend.data._M_elems[0];
      if (*(int *)(lVar12 + 0x58) <= lVar11) break;
      uVar4 = *(uint *)(*(long *)(lVar12 + 0x60) + lVar11 * 4);
      lVar13 = (long)(int)uVar4 * 0x38;
      uVar7 = *(undefined8 *)(lVar14 + 0x20 + lVar13);
      local_128.data._M_elems._32_5_ = SUB85(uVar7,0);
      local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar14 + lVar13);
      local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar14 + lVar13) + 2);
      puVar2 = (uint *)(lVar14 + 0x10 + lVar13);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar7 = *(undefined8 *)(puVar2 + 2);
      local_128.data._M_elems._24_5_ = SUB85(uVar7,0);
      local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_128.exp = *(int *)(lVar14 + 0x28 + lVar13);
      local_128.neg = *(bool *)(lVar14 + 0x2c + lVar13);
      local_128._48_8_ = *(undefined8 *)(lVar14 + 0x30 + lVar13);
      y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
      y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
      y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
      y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
      y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
      y.m_backend.exp = epsilon.m_backend.exp;
      y.m_backend.neg = epsilon.m_backend.neg;
      y.m_backend.fpclass = epsilon.m_backend.fpclass;
      y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
      if (epsilon.m_backend.fpclass != cpp_dec_float_finite || uVar3 != 0) {
        y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
      }
      tVar8 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_128,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&y.m_backend);
      if (tVar8) {
        pdVar10 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar10,(type *)0x0);
        tVar8 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)(lVar6 + lVar13),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar8) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar6 + lVar13),
                     (cpp_dec_float<50U,_int,_void> *)(lVar13 + lVar5));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_1.m_backend,&result.m_backend,local_e8);
LAB_0023b26d:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems._24_5_ = 0;
          y.m_backend.data._M_elems[7]._1_3_ = 0;
          y.m_backend.data._M_elems._32_5_ = 0;
          y.m_backend.data._M_elems[9]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_128);
          tVar8 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,val);
          if (tVar8) {
            *(ulong *)((val->m_backend).data._M_elems + 8) =
                 CONCAT35(y.m_backend.data._M_elems[9]._1_3_,y.m_backend.data._M_elems._32_5_);
            *(undefined8 *)((val->m_backend).data._M_elems + 4) = y.m_backend.data._M_elems._16_8_;
            *(ulong *)((val->m_backend).data._M_elems + 6) =
                 CONCAT35(y.m_backend.data._M_elems[7]._1_3_,y.m_backend.data._M_elems._24_5_);
            *(undefined8 *)(val->m_backend).data._M_elems = y.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((val->m_backend).data._M_elems + 2) = y.m_backend.data._M_elems._8_8_;
            (val->m_backend).exp = y.m_backend.exp;
            (val->m_backend).neg = y.m_backend.neg;
            (val->m_backend).fpclass = y.m_backend.fpclass;
            (val->m_backend).prec_elem = y.m_backend.prec_elem;
            local_18c = uVar4;
          }
        }
      }
      else {
        tVar8 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_128,&epsilon);
        if (tVar8) {
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)(local_f0 + lVar13);
          pdVar10 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar10,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar1,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar8) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,pcVar1,(cpp_dec_float<50U,_int,_void> *)(lVar13 + lVar5));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,&result.m_backend,local_e8);
            goto LAB_0023b26d;
          }
        }
      }
      lVar11 = lVar11 + 1;
    }
    if ((int)local_18c < 0) {
      return local_18c;
    }
    lVar12 = (ulong)local_18c * 0x38;
    uVar7 = *(undefined8 *)(lVar14 + 0x20 + lVar12);
    local_128.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_128.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar14 + lVar12);
    local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar14 + lVar12) + 2);
    puVar2 = (uint *)(lVar14 + 0x10 + lVar12);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar7 = *(undefined8 *)(puVar2 + 2);
    local_128.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_128.exp = *(int *)(lVar14 + 0x28 + lVar12);
    local_128.neg = *(bool *)(lVar14 + 0x2c + lVar12);
    local_128._48_8_ = *(undefined8 *)(lVar14 + 0x30 + lVar12);
    y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    y.m_backend.exp = epsilon.m_backend.exp;
    y.m_backend.neg = epsilon.m_backend.neg;
    y.m_backend.fpclass = epsilon.m_backend.fpclass;
    y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    if (epsilon.m_backend.fpclass != cpp_dec_float_finite || uVar3 != 0) {
      y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
    }
    tVar8 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128,&y);
    lVar14 = local_f0;
    if (((!tVar8) ||
        (tVar8 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar5 + lVar12),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar6 + lVar12)), !tVar8)) &&
       ((tVar8 = boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_128,&epsilon), !tVar8 ||
        (tVar8 = boost::multiprecision::operator<=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar5 + lVar12),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(lVar14 + lVar12)), !tVar8)))) {
      tVar8 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_128,&epsilon);
LAB_0023b435:
      if (tVar8 != false) {
        lVar14 = lVar6;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&val->m_backend,(cpp_dec_float<50U,_int,_void> *)(lVar14 + lVar12));
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_1.m_backend,&val->m_backend,
                 (cpp_dec_float<50U,_int,_void> *)(lVar5 + lVar12));
      y.m_backend.fpclass = cpp_dec_float_finite;
      y.m_backend.prec_elem = 10;
      y.m_backend.data._M_elems[0] = 0;
      y.m_backend.data._M_elems[1] = 0;
      y.m_backend.data._M_elems[2] = 0;
      y.m_backend.data._M_elems[3] = 0;
      y.m_backend.data._M_elems[4] = 0;
      y.m_backend.data._M_elems[5] = 0;
      y.m_backend.data._M_elems._24_5_ = 0;
      y.m_backend.data._M_elems[7]._1_3_ = 0;
      y.m_backend.data._M_elems._32_5_ = 0;
      y.m_backend.data._M_elems[9]._1_3_ = 0;
      y.m_backend.exp = 0;
      y.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&y.m_backend,&result_1.m_backend,&local_128);
      *(ulong *)((val->m_backend).data._M_elems + 8) =
           CONCAT35(y.m_backend.data._M_elems[9]._1_3_,y.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((val->m_backend).data._M_elems + 4) = y.m_backend.data._M_elems._16_8_;
      *(ulong *)((val->m_backend).data._M_elems + 6) =
           CONCAT35(y.m_backend.data._M_elems[7]._1_3_,y.m_backend.data._M_elems._24_5_);
      *(undefined8 *)(val->m_backend).data._M_elems = y.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 2) = y.m_backend.data._M_elems._8_8_;
      (val->m_backend).exp = y.m_backend.exp;
      (val->m_backend).neg = y.m_backend.neg;
      (val->m_backend).fpclass = y.m_backend.fpclass;
      (val->m_backend).prec_elem = y.m_backend.prec_elem;
      return local_18c;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)val,0.0);
  return local_18c;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}